

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O2

void emit_ARB1_finalize(Context *ctx)

{
  MOJOSHADER_shaderType MVar1;
  size_t extraout_RDX;
  size_t buflen;
  size_t extraout_RDX_00;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  char buf [64];
  char acStack_68 [64];
  
  push_output(ctx,&ctx->preflight);
  MVar1 = ctx->shader_type;
  if (MVar1 == MOJOSHADER_TYPE_VERTEX) {
    if (ctx->arb1_wrote_position != 0) goto LAB_0010c594;
    output_line(ctx,"OPTION ARB_position_invariant;");
    MVar1 = ctx->shader_type;
  }
  if ((MVar1 == MOJOSHADER_TYPE_PIXEL) && (ctx->have_multi_color_outputs != 0)) {
    output_line(ctx,"OPTION ARB_draw_buffers;");
  }
LAB_0010c594:
  pop_output(ctx);
  pcVar4 = "FLOAT TEMP";
  if (ctx->profile_supports_nv4 == 0) {
    pcVar4 = "TEMP";
  }
  push_output(ctx,&ctx->globals);
  buflen = extraout_RDX;
  for (iVar2 = 0; iVar2 < ctx->max_scratch_registers; iVar2 = iVar2 + 1) {
    allocate_ARB1_scratch_reg_name(ctx,acStack_68,buflen);
    output_line(ctx,"%s %s;",pcVar4,acStack_68);
    buflen = extraout_RDX_00;
  }
  if (((ctx->profile_supports_nv2 != 0) && (ctx->shader_type != MOJOSHADER_TYPE_PIXEL)) &&
     (ctx->profile_supports_nv4 == 0)) {
    for (uVar3 = 0; (int)uVar3 < ctx->max_reps; uVar3 = uVar3 + 1) {
      output_line(ctx,"TEMP rep%d;",(ulong)uVar3);
    }
  }
  pop_output(ctx);
  if (ctx->scratch_registers == ctx->max_scratch_registers) {
    return;
  }
  __assert_fail("ctx->scratch_registers == ctx->max_scratch_registers",
                "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                ,0x1b38,"void emit_ARB1_finalize(Context *)");
}

Assistant:

static void emit_ARB1_finalize(Context *ctx)
{
    push_output(ctx, &ctx->preflight);

    if (shader_is_vertex(ctx) && !ctx->arb1_wrote_position)
        output_line(ctx, "OPTION ARB_position_invariant;");

    if (shader_is_pixel(ctx) && ctx->have_multi_color_outputs)
        output_line(ctx, "OPTION ARB_draw_buffers;");

    pop_output(ctx);

    const char *tmpstr = arb1_float_temp(ctx);
    int i;
    push_output(ctx, &ctx->globals);
    for (i = 0; i < ctx->max_scratch_registers; i++)
    {
        char buf[64];
        allocate_ARB1_scratch_reg_name(ctx, buf, sizeof (buf));
        output_line(ctx, "%s %s;", tmpstr, buf);
    } // for

    // nv2 fragment programs (and anything nv4) have a real REP/ENDREP.
    if ( (support_nv2(ctx)) && (!shader_is_pixel(ctx)) && (!support_nv4(ctx)) )
    {
        // set up temps for nv2 REP/ENDREP emulation through branching.
        for (i = 0; i < ctx->max_reps; i++)
            output_line(ctx, "TEMP rep%d;", i);
    } // if

    pop_output(ctx);
    assert(ctx->scratch_registers == ctx->max_scratch_registers);
}